

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::reset(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
        *this)

{
  int *piVar1;
  long *plVar2;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  *pIVar3;
  BacktrackObject *pBVar4;
  BacktrackData *pBVar5;
  BacktrackObject *pBVar6;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  *pVVar7;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
  *pVVar8;
  
  pVVar7 = (this->_nodeIterators)._stack;
  (this->_svStack)._cursor = (this->_svStack)._stack;
  for (pVVar8 = (this->_nodeIterators)._cursor; pVVar8 != pVVar7; pVVar8 = pVVar8 + -1) {
    pIVar3 = pVVar8[-1]._core;
    if (pIVar3 != (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
                   *)0x0) {
      piVar1 = &pIVar3->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*pIVar3->_vptr_IteratorCore[1])();
      }
    }
    pVVar7 = (this->_nodeIterators)._stack;
  }
  (this->_nodeIterators)._cursor = pVVar7;
  (this->_bdStack)._cursor = (this->_bdStack)._stack;
  if (this->_normalizationRecording == true) {
    plVar2 = (long *)((long)(this->_algo)._unif._subs._self._M_t.
                            super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                            ._M_t + 0x10);
    *plVar2 = *plVar2 + -8;
    this->_normalizationRecording = false;
    pBVar6 = (this->_normalizationBacktrackData)._boList;
    while (pBVar6 != (BacktrackObject *)0x0) {
      (*pBVar6->_vptr_BacktrackObject[2])(pBVar6);
      pBVar4 = pBVar6->_next;
      (*pBVar6->_vptr_BacktrackObject[1])(pBVar6);
      pBVar6 = pBVar4;
    }
    (this->_normalizationBacktrackData)._boList = (BacktrackObject *)0x0;
  }
  while (pBVar5 = (this->_bdStack)._cursor, pBVar5 != (this->_bdStack)._stack) {
    (this->_bdStack)._cursor = pBVar5 + -1;
    pBVar6 = pBVar5[-1]._boList;
    while (pBVar6 != (BacktrackObject *)0x0) {
      (*pBVar6->_vptr_BacktrackObject[2])(pBVar6);
      pBVar4 = pBVar6->_next;
      (*pBVar6->_vptr_BacktrackObject[1])(pBVar6);
      pBVar6 = pBVar4;
    }
  }
  pBVar6 = (this->_queryInitBacktrackData)._boList;
  while (pBVar6 != (BacktrackObject *)0x0) {
    (*pBVar6->_vptr_BacktrackObject[2])(pBVar6);
    pBVar4 = pBVar6->_next;
    (*pBVar6->_vptr_BacktrackObject[1])(pBVar6);
    pBVar6 = pBVar4;
  }
  (this->_queryInitBacktrackData)._boList = (BacktrackObject *)0x0;
  return;
}

Assistant:

void reset() {
        _iterCntr.reset();
        _svStack.reset();
        _nodeIterators.reset();
        _bdStack.reset();
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }
        while(_bdStack.isNonEmpty()) {
          _bdStack.pop().backtrack();
        }
        _queryInitBacktrackData.backtrack();
      }